

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::CtrlInst::display(CtrlInst *this,ostream *o)

{
  any *this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  type_info *ptVar4;
  float fVar5;
  double dVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this_00 = &this->val;
  if ((this->super_Inst).field_0xd == '\x01') {
    poVar3 = std::operator<<(o,".");
    poVar3 = std::operator<<(poVar3,(string *)&this->key);
    std::operator<<(poVar3," ");
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&int::typeinfo);
    if (bVar1) {
      iVar2 = std::any_cast<int>(this_00);
      std::ostream::operator<<(o,iVar2);
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&double::typeinfo);
    if (bVar1) {
      dVar6 = std::any_cast<double>(this_00);
      std::ostream::_M_insert<double>(dVar6);
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&float::typeinfo);
    if (bVar1) {
      fVar5 = std::any_cast<float>(this_00);
      std::ostream::operator<<(o,fVar5);
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&long::typeinfo);
    if (bVar1) {
      std::any_cast<long>(this_00);
      std::ostream::_M_insert<long>((long)o);
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&std::__cxx11::string::typeinfo);
    if (!bVar1) {
      return;
    }
    std::any_cast<std::__cxx11::string>(&bStack_38,this_00);
    std::operator<<(o,(string *)&bStack_38);
  }
  else {
    poVar3 = std::operator<<(o,"@ ");
    poVar3 = std::operator<<(poVar3,(string *)&this->key);
    poVar3 = std::operator<<(poVar3,"<");
    ptVar4 = std::any::type(this_00);
    poVar3 = std::operator<<(poVar3,*(char **)(ptVar4 + 8) + (**(char **)(ptVar4 + 8) == '*'));
    std::operator<<(poVar3,">");
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&int::typeinfo);
    if (bVar1) {
      poVar3 = std::operator<<(o,"(value=");
      iVar2 = std::any_cast<int>(this_00);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3,")");
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&double::typeinfo);
    if (bVar1) {
      std::operator<<(o,"(value=");
      dVar6 = std::any_cast<double>(this_00);
      poVar3 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar3,")");
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&float::typeinfo);
    if (bVar1) {
      poVar3 = std::operator<<(o,"(value=");
      fVar5 = std::any_cast<float>(this_00);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      std::operator<<(poVar3,")");
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&long::typeinfo);
    if (bVar1) {
      poVar3 = std::operator<<(o,"(value=");
      std::any_cast<long>(this_00);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::operator<<(poVar3,")");
    }
    ptVar4 = std::any::type(this_00);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&std::__cxx11::string::typeinfo);
    if (!bVar1) {
      return;
    }
    poVar3 = std::operator<<(o,"(value=");
    std::any_cast<std::__cxx11::string>(&bStack_38,this_00);
    poVar3 = std::operator<<(poVar3,(string *)&bStack_38);
    std::operator<<(poVar3,")");
  }
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void CtrlInst::display(std::ostream &o) const {
  if (is_asm_option) {
    o << "." << key << " ";
    ctrl_inst_display_type_a(val, int);
    ctrl_inst_display_type_a(val, double);
    ctrl_inst_display_type_a(val, float);
    ctrl_inst_display_type_a(val, long);
    ctrl_inst_display_type_a(val, std::string);
  } else {
    o << "@ " << key << "<" << val.type().name() << ">";
    ctrl_inst_display_type(val, int);
    ctrl_inst_display_type(val, double);
    ctrl_inst_display_type(val, float);
    ctrl_inst_display_type(val, long);
    ctrl_inst_display_type(val, std::string);
  }
}